

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

optional<unsigned_int> __thiscall
slang::ast::BinaryExpression::getEffectiveWidthImpl(BinaryExpression *this)

{
  _Optional_payload_base<unsigned_int> _Var1;
  _Optional_payload_base<unsigned_int> _Var2;
  ulong uVar3;
  bool bVar4;
  
  _Var2._M_payload = (_Storage<unsigned_int,_true>)0x0;
  _Var2._M_engaged = true;
  _Var2._5_3_ = 0;
  _Var1._M_payload = (_Storage<unsigned_int,_true>)0x1;
  _Var1._M_engaged = false;
  _Var1._5_3_ = 0;
  uVar3 = 0;
  if ((0x7ffe00U >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
    if ((0x1ffU >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
      _Var1 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(this->left_);
      uVar3 = (ulong)_Var1 & 0xffffff0000000000;
      _Var2 = _Var1;
    }
    else {
      _Var1 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(this->left_);
      _Var2 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(this->right_);
      if ((((ulong)_Var1 & 0x100000000) == 0) || (((ulong)_Var2 >> 0x20 & 1) == 0)) {
        bVar4 = (bool)(_Var2._M_engaged & ((ulong)_Var1 & 0x100000000) == 0);
      }
      else {
        bVar4 = _Var1._M_payload._M_value < _Var2._M_payload._M_value;
      }
      if (bVar4 != false) {
        _Var1 = _Var2;
      }
      uVar3 = (ulong)_Var1 & 0xffffff0000000000;
      _Var2 = _Var1;
    }
  }
  return (optional<unsigned_int>)((ulong)_Var1 & 0xffffffff | (ulong)_Var2 & 0xff00000000 | uVar3);
}

Assistant:

std::optional<bitwidth_t> BinaryExpression::getEffectiveWidthImpl() const {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            return 1;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
        case BinaryOperator::Power:
            return left().getEffectiveWidth();
    }
    SLANG_UNREACHABLE;
}